

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::Slider::draw(Slider *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  Widget *in_RDI;
  RenderStates *in_stack_00000060;
  float thumbWidth;
  Vector2f *in_stack_ffffffffffffff88;
  Slider *in_stack_ffffffffffffff90;
  Color *in_stack_ffffffffffffff98;
  Vector2<float> local_20;
  Color local_18;
  float local_14;
  __shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_10;
  
  local_10 = in_RSI;
  bVar1 = Widget::isVisible(in_RDI);
  if (bVar1) {
    Widget::getTransform((Widget *)0x28c7cd);
    sf::operator*=((Transform *)in_stack_ffffffffffffff90,(Transform *)in_stack_ffffffffffffff88);
    local_14 = getThumbWidth(in_stack_ffffffffffffff90);
    std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28c7ff);
    sf::RectangleShape::setSize
              ((RectangleShape *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    bVar1 = Widget::isMouseHovering(in_RDI);
    if (bVar1) {
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c838);
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c852);
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c86e);
      local_18 = Style::blendColors(in_stack_ffffffffffffff98,(Color *)in_stack_ffffffffffffff90);
      sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88)
      ;
    }
    else {
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c8a8);
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c8c2);
      sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88)
      ;
    }
    std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28c8f1);
    sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
    std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28c918);
    sf::Vector2<float>::Vector2(&local_20,local_14,*(float *)&in_RDI[1].onMouseLeave);
    sf::RectangleShape::setSize
              ((RectangleShape *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    peVar2 = std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x28c964);
    sf::Transformable::setPosition
              (&(peVar2->thumb_).super_Shape.super_Transformable,
               ((*(float *)&in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left -
                *(float *)&in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_parent) /
               (*(float *)((long)&in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_parent + 4) -
               *(float *)&in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_parent)) *
               (*(float *)((long)&in_RDI[1].onMouseEnter.callbacks_._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count + 4) - local_14),0.0);
    std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28c9c6);
    if (((ulong)in_RDI[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right & 1) == 0) {
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28ca12);
    }
    else {
      std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x28c9f4);
    }
    sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
    std::__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28ca47);
    sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
    bVar1 = std::operator!=((shared_ptr<gui::Label> *)local_10,in_stack_ffffffffffffff88);
    if (bVar1) {
      std::__shared_ptr_access<gui::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (local_10);
      sf::RenderTarget::draw((RenderTarget *)this,(Drawable *)target,in_stack_00000060);
    }
  }
  return;
}

Assistant:

void Slider::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    const float thumbWidth = getThumbWidth();

    style_->rect_.setSize(size_);
    if (isMouseHovering()) {
        style_->rect_.setFillColor(Style::blendColors(style_->colorRectHover_, style_->colorRect_));
    } else {
        style_->rect_.setFillColor(style_->colorRect_);
    }
    target.draw(style_->rect_, states);
    style_->thumb_.setSize({thumbWidth, size_.y});
    style_->thumb_.setPosition((value_ - range_.first) / (range_.second - range_.first) * (size_.x - thumbWidth), 0.0f);
    style_->thumb_.setFillColor(isDragging_ ? style_->colorThumbDown_ : style_->colorThumb_);
    target.draw(style_->thumb_, states);

    if (label_ != nullptr) {
        target.draw(*label_, states);
    }
}